

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::ChooseRenderPassAndFramebuffer(DeviceContextVkImpl *this)

{
  RefCntAutoPtr<Diligent::ITextureView> *this_00;
  ITexture *pIVar1;
  RenderDeviceVkImpl *pRVar2;
  FramebufferCache *this_01;
  RenderPassCache *this_02;
  ITextureView *pIVar3;
  RenderingInfoWrapper *pRVar4;
  _Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false> __ptr_00;
  uint uVar5;
  undefined8 uVar6;
  undefined1 uVar7;
  int iVar8;
  float fVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureViewVkImpl *pTVar10;
  RenderPassVkImpl *pRVar11;
  VkFramebuffer pVVar12;
  undefined4 extraout_var_03;
  TextureFormatAttribs *pTVar13;
  undefined4 extraout_var_04;
  long lVar14;
  unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  *this_03;
  pointer *__ptr;
  ulong uVar15;
  bool bVar16;
  string msg;
  undefined1 local_108 [16];
  undefined1 local_f8 [17];
  undefined1 uStack_e7;
  bool bStack_e6;
  undefined5 uStack_e5;
  undefined2 auStack_e2 [5];
  undefined6 uStack_d8;
  size_type local_d0;
  CreateDyanmicRenderInfoAttribs local_c8;
  FramebufferCacheKey local_a0;
  
  local_a0.Pass = (VkRenderPass)0x0;
  local_a0.NumRenderTargets = 0;
  local_a0.RTVs[0] = (VkImageView)0x0;
  local_a0.RTVs[1] = (VkImageView)0x0;
  local_a0.RTVs[2] = (VkImageView)0x0;
  local_a0.RTVs[3] = (VkImageView)0x0;
  local_a0.RTVs[4] = (VkImageView)0x0;
  local_a0.RTVs[5] = (VkImageView)0x0;
  local_a0.RTVs[6] = (VkImageView)0x0;
  local_a0.RTVs[7] = (VkImageView)0x0;
  local_a0.ShadingRate = (VkImageView)0x0;
  local_a0.CommandQueueMask = 0;
  local_a0.Hash = 0;
  uStack_d8 = 0;
  auStack_e2[1] = 0;
  auStack_e2[2] = 0;
  auStack_e2[3] = 0;
  auStack_e2[4] = 0;
  local_d0 = 0;
  pTVar10 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar10 == (TextureViewVkImpl *)0x0) {
    local_a0.DSV = (VkImageView_T *)0x0;
    stack0xffffffffffffff18 = (__pthread_internal_list *)0x0;
  }
  else {
    local_a0.DSV = (pTVar10->m_ImageView).m_VkObject;
    stack0xffffffffffffff18 =
         (ulong)CONCAT21((pTVar10->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.Format,
                         (pTVar10->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) << 0x18;
    iVar8 = (*(((pTVar10->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
              super_IDeviceObject).super_IObject._vptr_IObject[4])();
    stack0xffffffffffffff18 =
         (ulong)CONCAT61(_bStack_e6,*(undefined1 *)(CONCAT44(extraout_var,iVar8) + 0x20)) << 8;
  }
  local_a0.NumRenderTargets =
       (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  local_f8[0x10] = (char)local_a0.NumRenderTargets;
  if (local_a0.NumRenderTargets != 0) {
    uVar15 = 0;
    do {
      pTVar10 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar15].
                m_pObject;
      if (pTVar10 == (TextureViewVkImpl *)0x0) {
        local_a0.RTVs[uVar15] = (VkImageView)0x0;
        ((undefined2 *)((long)register0x00000020 + -0xe2))[uVar15] = 0;
      }
      else {
        pIVar1 = (pTVar10->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
        local_a0.RTVs[uVar15] = (pTVar10->m_ImageView).m_VkObject;
        iVar8 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
        ((undefined2 *)((long)register0x00000020 + -0xe2))[uVar15] =
             *(undefined2 *)(CONCAT44(extraout_var_00,iVar8) + 0x18);
        uVar7 = uStack_e7;
        if (uStack_e7 == 0) {
          iVar8 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
          uStack_e7 = *(undefined1 *)(CONCAT44(extraout_var_02,iVar8) + 0x20);
        }
        else {
          iVar8 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
          if (*(uint *)(CONCAT44(extraout_var_01,iVar8) + 0x20) != (uint)(byte)uVar7) {
            FormatString<char[26]>((string *)local_108,(char (*) [26])"Inconsistent sample count");
            DebugAssertionFailed
                      ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x767);
            if ((RenderingInfoWrapper *)local_108._0_8_ !=
                (RenderingInfoWrapper *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
            }
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets)
    ;
  }
  if (uStack_e7 == '\0') {
    uStack_e7 = (char)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples;
  }
  this_00 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap;
  bVar16 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject ==
           (ITextureView *)0x0;
  if (bVar16) {
    local_a0.ShadingRate = (VkImageView_T *)0x0;
  }
  else {
    pTVar10 = RefCntAutoPtr<Diligent::ITextureView>::RawPtr<Diligent::TextureViewVkImpl>(this_00);
    local_a0.ShadingRate = (pTVar10->m_ImageView).m_VkObject;
  }
  bStack_e6 = !bVar16;
  pRVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  this_01 = (pRVar2->m_FramebufferCache)._M_t.
            super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
            .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl;
  this_02 = (pRVar2->m_ImplicitRenderPassCache)._M_t.
            super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
            .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
  if (this_02 == (RenderPassCache *)0x0 || this_01 == (FramebufferCache *)0x0) {
    local_c8.ShadingRateTexelSize.width = 0;
    local_c8.ShadingRateTexelSize.height = 0;
    local_c8.UseDepthAttachment = false;
    local_c8.UseStencilAttachment = false;
    local_c8.ReadOnlyDepthStencil = false;
    local_c8.Extent.width =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
    local_c8.Extent.height =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
    local_c8.Layers =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices;
    local_c8.ViewMask = 0;
    pTVar10 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
    bVar16 = pTVar10 != (TextureViewVkImpl *)0x0;
    if (bVar16) {
      iVar8 = (*(((pTVar10->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                super_IDeviceObject).super_IObject._vptr_IObject[4])();
      pTVar13 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(CONCAT44(extraout_var_03,iVar8) + 0x18))
      ;
      local_c8.UseStencilAttachment = pTVar13->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
      local_c8.ReadOnlyDepthStencil =
           (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
           super_TextureViewBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
           .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
    }
    pIVar3 = this_00->m_pObject;
    local_c8.UseDepthAttachment = bVar16;
    if (pIVar3 != (ITextureView *)0x0) {
      iVar8 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[10])();
      lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x20))
                         ((long *)CONCAT44(extraout_var_04,iVar8));
      fVar9 = (float)((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth /
                     *(uint *)(lVar14 + 0xc));
      iVar8 = 0x1f;
      if (fVar9 != 0.0) {
        for (; (uint)fVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      local_c8.ShadingRateTexelSize.width = 1 << (-((byte)iVar8 ^ 0x1f) & 0x1f);
      if (((uint)fVar9 & (int)fVar9 - 1U) == 0) {
        local_c8.ShadingRateTexelSize.width = (uint32_t)fVar9;
      }
      uVar5 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight /
              *(uint *)(lVar14 + 0x10);
      iVar8 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      local_c8.ShadingRateTexelSize.height = 1 << (-((byte)iVar8 ^ 0x1f) & 0x1f);
      if ((uVar5 & uVar5 - 1) == 0) {
        local_c8.ShadingRateTexelSize.height = uVar5;
      }
    }
    pRVar4 = (this->m_DynamicRenderingInfo)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    if ((pRVar4 != (RenderingInfoWrapper *)0x0) && (pRVar4->m_AttachmentClearMask != 0)) {
      FormatString<char[52]>
                ((string *)local_108,
                 (char (*) [52])"There are pending clears in the dynamic render pass");
      DebugAssertionFailed
                ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x7aa);
      if ((RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
      }
    }
    this_03 = &this->m_DynamicRenderingInfo;
    FramebufferCache::CreateDyanmicRenderInfo((FramebufferCache *)local_108,&local_a0,&local_c8);
    uVar6 = local_108._0_8_;
    local_108._0_8_ = (RenderingInfoWrapper *)0x0;
    __ptr_00._M_head_impl =
         (this_03->_M_t).
         super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
         ._M_t.
         super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
         .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    (this_03->_M_t).
    super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ._M_t.
    super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl =
         (RenderingInfoWrapper *)uVar6;
    if (__ptr_00._M_head_impl != (RenderingInfoWrapper *)0x0) {
      std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
                ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)this_03,
                 __ptr_00._M_head_impl);
    }
    if ((RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)0x0) {
      std::default_delete<VulkanUtilities::RenderingInfoWrapper>::operator()
                ((default_delete<VulkanUtilities::RenderingInfoWrapper> *)local_108,
                 (RenderingInfoWrapper *)local_108._0_8_);
    }
  }
  else {
    pRVar11 = RenderPassCache::GetRenderPass(this_02,(RenderPassCacheKey *)(local_f8 + 0x10));
    if (pRVar11 == (RenderPassVkImpl *)0x0) {
      FormatString<char[65]>
                ((string *)local_108,
                 (char (*) [65])"Unable to get render pass for the currently bound render targets");
      DebugAssertionFailed
                ((Char *)local_108._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x78b);
      if ((RenderingInfoWrapper *)local_108._0_8_ != (RenderingInfoWrapper *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,local_f8._0_8_ + 1);
      }
      this->m_vkRenderPass = (VkRenderPass)0x0;
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
    }
    else {
      local_a0.Pass = (pRVar11->m_VkRenderPass).m_VkObject;
      this->m_vkRenderPass = local_a0.Pass;
      local_a0.CommandQueueMask = 0xffffffffffffffff;
      pVVar12 = FramebufferCache::GetFramebuffer
                          (this_01,&local_a0,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
                           (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight
                           ,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                            m_FramebufferSlices);
      this->m_vkFramebuffer = pVVar12;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::ChooseRenderPassAndFramebuffer()
{
    FramebufferCache::FramebufferCacheKey FBKey;
    RenderPassCache::RenderPassCacheKey   RenderPassKey;
    if (m_pBoundDepthStencil)
    {
        ITexture* pDepthBuffer    = m_pBoundDepthStencil->GetTexture();
        FBKey.DSV                 = m_pBoundDepthStencil->GetVulkanImageView();
        RenderPassKey.DSVFormat   = m_pBoundDepthStencil->GetDesc().Format;
        RenderPassKey.ReadOnlyDSV = m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
        RenderPassKey.SampleCount = static_cast<Uint8>(pDepthBuffer->GetDesc().SampleCount);
    }
    else
    {
        FBKey.DSV               = VK_NULL_HANDLE;
        RenderPassKey.DSVFormat = TEX_FORMAT_UNKNOWN;
    }

    FBKey.NumRenderTargets         = m_NumBoundRenderTargets;
    RenderPassKey.NumRenderTargets = static_cast<Uint8>(m_NumBoundRenderTargets);

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewVkImpl* pRTVVk = m_pBoundRenderTargets[rt])
        {
            ITexture* pRenderTarget      = pRTVVk->GetTexture();
            FBKey.RTVs[rt]               = pRTVVk->GetVulkanImageView();
            RenderPassKey.RTVFormats[rt] = pRenderTarget->GetDesc().Format;
            if (RenderPassKey.SampleCount == 0)
                RenderPassKey.SampleCount = static_cast<Uint8>(pRenderTarget->GetDesc().SampleCount);
            else
                VERIFY(RenderPassKey.SampleCount == pRenderTarget->GetDesc().SampleCount, "Inconsistent sample count");
        }
        else
        {
            FBKey.RTVs[rt]               = VK_NULL_HANDLE;
            RenderPassKey.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;
        }
    }

    if (RenderPassKey.SampleCount == 0)
        RenderPassKey.SampleCount = static_cast<Uint8>(m_FramebufferSamples);

    if (m_pBoundShadingRateMap)
    {
        FBKey.ShadingRate       = m_pBoundShadingRateMap.RawPtr<TextureViewVkImpl>()->GetVulkanImageView();
        RenderPassKey.EnableVRS = true;
    }
    else
    {
        FBKey.ShadingRate       = VK_NULL_HANDLE;
        RenderPassKey.EnableVRS = false;
    }

    FramebufferCache* FBCache = m_pDevice->GetFramebufferCache();
    RenderPassCache*  RPCache = m_pDevice->GetImplicitRenderPassCache();
    if (FBCache != nullptr && RPCache != nullptr)
    {
        if (RenderPassVkImpl* pRenderPass = RPCache->GetRenderPass(RenderPassKey))
        {
            m_vkRenderPass         = pRenderPass->GetVkRenderPass();
            FBKey.Pass             = m_vkRenderPass;
            FBKey.CommandQueueMask = ~Uint64{0};
            m_vkFramebuffer        = FBCache->GetFramebuffer(FBKey, m_FramebufferWidth, m_FramebufferHeight, m_FramebufferSlices);
        }
        else
        {
            UNEXPECTED("Unable to get render pass for the currently bound render targets");
            m_vkRenderPass  = VK_NULL_HANDLE;
            m_vkFramebuffer = VK_NULL_HANDLE;
        }
    }
    else
    {
        FramebufferCache::CreateDyanmicRenderInfoAttribs CreateRIAttribs;
        CreateRIAttribs.Extent   = {m_FramebufferWidth, m_FramebufferHeight};
        CreateRIAttribs.Layers   = m_FramebufferSlices;
        CreateRIAttribs.ViewMask = 0;
        if (m_pBoundDepthStencil)
        {
            const TEXTURE_FORMAT        DepthStencilFmt = m_pBoundDepthStencil->GetTexture()->GetDesc().Format;
            const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(DepthStencilFmt);

            CreateRIAttribs.UseDepthAttachment   = true;
            CreateRIAttribs.UseStencilAttachment = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
            CreateRIAttribs.ReadOnlyDepthStencil = (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        }
        if (m_pBoundShadingRateMap)
        {
            const TextureDesc& ShadingRateDesc = m_pBoundShadingRateMap->GetTexture()->GetDesc();
            // Framebuffer size may not be an integer multiple of the shading rate texel size
            // Shading rate texel size be a power of two
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06149
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06152
            CreateRIAttribs.ShadingRateTexelSize.width  = AlignUpToPowerOfTwo(m_FramebufferWidth / ShadingRateDesc.Width);
            CreateRIAttribs.ShadingRateTexelSize.height = AlignUpToPowerOfTwo(m_FramebufferHeight / ShadingRateDesc.Height);
        }

        VERIFY(!m_DynamicRenderingInfo || !m_DynamicRenderingInfo->HasClears(), "There are pending clears in the dynamic render pass");
        m_DynamicRenderingInfo = FramebufferCache::CreateDyanmicRenderInfo(FBKey, CreateRIAttribs);
    }
}